

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedResult.cpp
# Opt level: O0

void __thiscall oout::FmtNamed::~FmtNamed(FmtNamed *this)

{
  FmtNamed *this_local;
  
  ~FmtNamed(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

FmtNamed(const Format *format, const string &name)
		: format(format), name(name)
	{
	}